

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.hpp
# Opt level: O0

string_view cinatra::get_gmt_time_str(time_point t)

{
  bool bVar1;
  duration __t;
  __enable_if_is_duration<std::chrono::duration<long>_> __rhs;
  size_type sVar2;
  long *in_FS_OFFSET;
  time_t tm;
  seconds s;
  duration d;
  string_view str;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffc8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  string_view local_10;
  
  __t = std::chrono::
        time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        ::time_since_epoch(&local_18);
  __rhs = std::chrono::
          duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                    (in_stack_ffffffffffffffc8);
  bVar1 = std::chrono::operator==
                    ((duration<long,_std::ratio<1L,_1L>_> *)__t.__r,
                     (duration<long,_std::ratio<1L,_1L>_> *)__rhs.__r);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_10,(char *)(*in_FS_OFFSET + -0x60),*(size_type *)(*in_FS_OFFSET + -0x38));
  }
  else {
    std::chrono::_V2::system_clock::to_time_t((time_point *)__t.__r);
    local_10 = get_gmt_time_str<32ul>((char (*) [32])s.__r,tm);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
    *(size_type *)(*in_FS_OFFSET + -0x38) = sVar2;
    *(rep *)(*in_FS_OFFSET + -0x40) = __rhs.__r;
  }
  return local_10;
}

Assistant:

inline std::string_view get_gmt_time_str(
    std::chrono::system_clock::time_point t) {
  static thread_local char buf[32];
  static thread_local std::chrono::seconds last_sec{};
  static thread_local size_t last_size{};

  std::chrono::system_clock::duration d = t.time_since_epoch();
  std::chrono::seconds s = std::chrono::duration_cast<std::chrono::seconds>(d);
  if (last_sec == s) {
    return {buf, last_size};
  }

  auto tm = std::chrono::system_clock::to_time_t(t);

  auto str = get_gmt_time_str(buf, tm);
  last_size = str.size();
  last_sec = s;

  return str;
}